

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

RegNum __thiscall
LinearScan::SpillLiveRange(LinearScan *this,Lifetime *spilledRange,Instr *insertionInstr)

{
  RegNum reg;
  uint32 uVar1;
  uint32 uVar2;
  StackSym *this_00;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint functionId;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  uint uVar7;
  ulong uVar8;
  
  if ((spilledRange->field_0x9c & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb13,"(!spilledRange->isSpilled)","!spilledRange->isSpilled");
    if (!bVar4) goto LAB_0058d559;
    *puVar6 = 0;
  }
  reg = spilledRange->reg;
  uVar8 = (ulong)reg;
  this_00 = spilledRange->sym;
  *(ushort *)&spilledRange->field_0x9c =
       ((ushort)*(undefined4 *)&spilledRange->field_0x9c & 0xfbfe) + 1;
  spilledRange->reg = RegNOREG;
  if ((this_00->field_0x19 & 0x10) == 0) {
    bVar4 = StackSym::IsConst(this_00);
    if (bVar4) {
      bVar4 = IsSymNonTempLocalVar(this,this_00);
      if (!bVar4) goto LAB_0058d283;
    }
    AllocateStackSpace(this,spilledRange);
  }
LAB_0058d283:
  if ((spilledRange->field_0x9c & 8) == 0) {
    bVar4 = IsSymNonTempLocalVar(this,this_00);
    if (!bVar4) {
      InsertStores(this,spilledRange,reg,insertionInstr);
    }
    if (this->loopNest == 0) {
      bVar4 = StackSym::IsConst(this_00);
      if (bVar4) goto LAB_0058d2c6;
      SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear
                ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                 ((long)this_00->scratch + 0x30));
    }
    else {
LAB_0058d2c6:
      InsertLoads(this,this_00,reg);
    }
    Lifetime::ApplyUseCountAdjust(spilledRange,this->curLoop);
  }
  if (((uVar8 != 0) && (spilledRange->reg != RegNOREG)) && (this->regContent[uVar8] != spilledRange)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb38,
                       "(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange)"
                       ,
                       "reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange"
                      );
    if (!bVar4) goto LAB_0058d559;
    *puVar6 = 0;
  }
  uVar7 = (uint)reg;
  if ((spilledRange->field_0x9d & 2) == 0) {
    BVUnitT<unsigned_long>::AssertRange(uVar7);
    if (((this->secondChanceRegs).word >> (uVar8 & 0x3f) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xb42,"(!this->secondChanceRegs.Test(reg))",
                         "!this->secondChanceRegs.Test(reg)");
      if (bVar4) {
        *puVar6 = 0;
        goto LAB_0058d488;
      }
      goto LAB_0058d559;
    }
    goto LAB_0058d488;
  }
  if ((uVar8 != 0) && (spilledRange->reg != RegNOREG)) {
    if (this->regContent[uVar8] == spilledRange) {
      BVUnitT<unsigned_long>::AssertRange(uVar7);
      if (((this->secondChanceRegs).word >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0058d468;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb3c,
                       "(reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)))"
                       ,
                       "reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg))"
                      );
    if (!bVar4) {
LAB_0058d559:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
LAB_0058d468:
  BVUnitT<unsigned_long>::AssertRange(uVar7);
  (this->secondChanceRegs).word =
       (this->secondChanceRegs).word &
       (-2L << (reg & (RegXMM15|RegXMM14)) |
       0xfffffffffffffffeU >> 0x40 - (reg & (RegXMM15|RegXMM14)));
  spilledRange->field_0x9d = spilledRange->field_0x9d & 0xfd;
LAB_0058d488:
  this->regContent[uVar8] = (Lifetime *)0x0;
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,LinearScanPhase,uVar5,functionId);
  if (bVar4) {
    Output::Print(L"**** Spill: ");
    Sym::Dump(&this_00->super_Sym,(ValueType)0x9);
    Output::Print(L"(%S)",RegNames[uVar8]);
    uVar1 = spilledRange->end;
    uVar7 = spilledRange->useCount;
    uVar2 = spilledRange->start;
    uVar5 = GetSpillCost(this,spilledRange);
    Output::Print(L"  SpillCount:%d  Length:%d   Cost:%d\n",(ulong)uVar7,(ulong)(uVar1 - uVar2),
                  (ulong)uVar5);
  }
  return reg;
}

Assistant:

RegNum
LinearScan::SpillLiveRange(Lifetime * spilledRange, IR::Instr *insertionInstr)
{
    Assert(!spilledRange->isSpilled);

    RegNum reg = spilledRange->reg;
    StackSym *sym = spilledRange->sym;

    spilledRange->isSpilled = true;
    spilledRange->isCheapSpill = false;
    spilledRange->reg = RegNOREG;

    // Don't allocate stack space for const, we always reload them. (For debugm mode, allocate on the stack)
    if (!sym->IsAllocated() && (!sym->IsConst() || IsSymNonTempLocalVar(sym)))
    {
       this->AllocateStackSpace(spilledRange);
    }

    // No need to insert loads or stores if there are no uses.
    if (!spilledRange->isDeadStore)
    {
        // In the debug mode, don't do insertstore for this stacksym, as we want to retain the IsConst for the sym,
        // and later we are going to find the reg for it.
        if (!IsSymNonTempLocalVar(sym))
        {
            this->InsertStores(spilledRange, reg, insertionInstr);
        }

        if (this->IsInLoop() || sym->IsConst())
        {
            this->InsertLoads(sym, reg);
        }
        else
        {
            sym->scratch.linearScan.lifetime->useList.Clear();
        }
        // Adjust useCount in case of second chance allocation
        spilledRange->ApplyUseCountAdjust(this->curLoop);
    }

    Assert(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange);
    if (spilledRange->isSecondChanceAllocated)
    {
        Assert(reg == RegNOREG || spilledRange->reg == RegNOREG
            || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)));
        this->secondChanceRegs.Clear(reg);
        spilledRange->isSecondChanceAllocated = false;
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(reg));
    }
    this->regContent[reg] = nullptr;

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("**** Spill: "));
        sym->Dump();
        Output::Print(_u("(%S)"), RegNames[reg]);
        Output::Print(_u("  SpillCount:%d  Length:%d   Cost:%d\n"),
            spilledRange->useCount, spilledRange->end - spilledRange->start, this->GetSpillCost(spilledRange));
    }
#endif
    return reg;
}